

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O1

StringRef * __thiscall
axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getLeftSubString
          (StringRef *__return_storage_ptr__,
          StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this,size_t length)

{
  C *pCVar1;
  BufHdr *hdr;
  
  if (length < this->m_length) {
    pCVar1 = this->m_p;
    hdr = this->m_hdr;
    *(undefined8 *)((long)&__return_storage_ptr__->m_hdr + 1) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->m_length + 1) = 0;
    __return_storage_ptr__->m_p = (C *)0x0;
    __return_storage_ptr__->m_hdr = (BufHdr *)0x0;
    attachBufHdr(__return_storage_ptr__,hdr);
    __return_storage_ptr__->m_p = pCVar1;
    __return_storage_ptr__->m_length = length;
    __return_storage_ptr__->m_isNullTerminated = false;
  }
  else {
    StringRefBase(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

StringRef
	getLeftSubString(size_t length) const {
		if (length >= m_length)
			return *this;

		return StringRef(m_hdr, m_p, length);
	}